

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codec.c
# Opt level: O3

int base64_stream_decode_sse41(base64_state *state,char *src,size_t srclen,char *out,size_t *outlen)

{
  byte bVar1;
  undefined1 *puVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  uint uVar8;
  int iVar9;
  undefined1 (*pauVar10) [16];
  size_t sVar11;
  bool bVar12;
  ulong uVar13;
  undefined1 (*pauVar14) [16];
  byte bVar15;
  uint uVar16;
  size_t sVar17;
  size_t sVar18;
  ulong uVar19;
  long lVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  char cVar24;
  char cVar25;
  char cVar26;
  char cVar27;
  char cVar28;
  char cVar29;
  char cVar30;
  char cVar31;
  char cVar32;
  char cVar33;
  char cVar34;
  char cVar35;
  char cVar36;
  char cVar37;
  char cVar38;
  char cVar39;
  char cVar40;
  char cVar41;
  char cVar42;
  char cVar43;
  char cVar44;
  char cVar45;
  char cVar46;
  char cVar47;
  char cVar48;
  char cVar49;
  char cVar50;
  char cVar51;
  char cVar52;
  char cVar53;
  char cVar54;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  char cVar78;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  
  iVar9 = state->eof;
  if (iVar9 != 0) {
    *outlen = 0;
    if (iVar9 == 1 && srclen != 0) {
      state->eof = 2;
      state->bytes = 0;
      bVar12 = srclen == 1 && base64_table_dec_8bit[(byte)*src] == 0xfe;
    }
    else {
      bVar12 = false;
    }
    goto LAB_001057b7;
  }
  bVar15 = state->carry;
  sVar18 = (size_t)(uint)state->bytes;
  iVar9 = 0;
  sVar17 = 0;
  sVar11 = srclen;
  uVar8 = state->bytes;
  switch(sVar18) {
  case 0:
    do {
      auVar7 = _DAT_0010d070;
      auVar6 = _DAT_0010d060;
      auVar5 = _DAT_0010d050;
      auVar4 = _DAT_0010d030;
      auVar3 = _DAT_0010d020;
      auVar23 = _DAT_0010d010;
      auVar22 = _DAT_0010d000;
      if (0x17 < srclen) {
        uVar19 = srclen - 8 >> 4;
        auVar21 = ZEXT816(0xb9b9bfbf04131000);
        uVar13 = uVar19;
        do {
          cVar24 = auVar3[0];
          cVar25 = auVar3[1];
          cVar26 = auVar3[2];
          cVar27 = auVar3[3];
          cVar28 = auVar3[4];
          cVar29 = auVar3[5];
          cVar30 = auVar3[6];
          cVar31 = auVar3[7];
          cVar32 = auVar3[8];
          cVar33 = auVar3[9];
          cVar34 = auVar3[10];
          cVar35 = auVar3[0xb];
          cVar36 = auVar3[0xc];
          cVar37 = auVar3[0xd];
          cVar38 = auVar3[0xe];
          cVar39 = auVar3[0xf];
          if (uVar13 < 8) {
            if (uVar13 < 4) {
              auVar81 = *(undefined1 (*) [16])src;
              auVar79._0_4_ = auVar81._0_4_ >> 4;
              auVar79._4_4_ = auVar81._4_4_ >> 4;
              auVar79._8_4_ = auVar81._8_4_ >> 4;
              auVar79._12_4_ = auVar81._12_4_ >> 4;
              auVar79 = auVar79 & auVar22;
              auVar93 = pshufb(auVar23,auVar79);
              auVar106 = pshufb(auVar4,auVar81 & auVar3);
              auVar106 = auVar106 & auVar93;
              auVar93[0] = -('\0' < auVar106[0]);
              auVar93[1] = -('\0' < auVar106[1]);
              auVar93[2] = -('\0' < auVar106[2]);
              auVar93[3] = -('\0' < auVar106[3]);
              auVar93[4] = -('\0' < auVar106[4]);
              auVar93[5] = -('\0' < auVar106[5]);
              auVar93[6] = -('\0' < auVar106[6]);
              auVar93[7] = -('\0' < auVar106[7]);
              auVar93[8] = -('\0' < auVar106[8]);
              auVar93[9] = -('\0' < auVar106[9]);
              auVar93[10] = -('\0' < auVar106[10]);
              auVar93[0xb] = -('\0' < auVar106[0xb]);
              auVar93[0xc] = -('\0' < auVar106[0xc]);
              auVar93[0xd] = -('\0' < auVar106[0xd]);
              auVar93[0xe] = -('\0' < auVar106[0xe]);
              bVar12 = '\0' < auVar106[0xf];
              auVar93[0xf] = -bVar12;
              cVar40 = auVar81[1];
              cVar41 = auVar81[2];
              cVar42 = auVar81[3];
              cVar43 = auVar81[4];
              cVar44 = auVar81[5];
              cVar45 = auVar81[6];
              cVar46 = auVar81[7];
              cVar47 = auVar81[8];
              cVar48 = auVar81[9];
              cVar49 = auVar81[10];
              cVar50 = auVar81[0xb];
              cVar51 = auVar81[0xc];
              cVar52 = auVar81[0xd];
              cVar53 = auVar81[0xe];
              cVar54 = auVar81[0xf];
              cVar78 = auVar81[0];
              if (uVar13 < 2) {
                if ((((((((((((((((auVar93 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                                 (auVar93 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                                || (auVar93 >> 0x17 & (undefined1  [16])0x1) !=
                                   (undefined1  [16])0x0) ||
                               (auVar93 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                              || (auVar93 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                             || (auVar93 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                            || (auVar93 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                           || (auVar93 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar93 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar93 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar93 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar93 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar93 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar93 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar93 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) || bVar12)
                goto LAB_00105669;
                auVar22[0] = auVar79[0] - (cVar78 == '/');
                auVar22[1] = auVar79[1] - (cVar40 == '/');
                auVar22[2] = auVar79[2] - (cVar41 == '/');
                auVar22[3] = auVar79[3] - (cVar42 == '/');
                auVar22[4] = auVar79[4] - (cVar43 == '/');
                auVar22[5] = auVar79[5] - (cVar44 == '/');
                auVar22[6] = auVar79[6] - (cVar45 == '/');
                auVar22[7] = auVar79[7] - (cVar46 == '/');
                auVar22[8] = auVar79[8] - (cVar47 == '/');
                auVar22[9] = auVar79[9] - (cVar48 == '/');
                auVar22[10] = auVar79[10] - (cVar49 == '/');
                auVar22[0xb] = auVar79[0xb] - (cVar50 == '/');
                auVar22[0xc] = auVar79[0xc] - (cVar51 == '/');
                auVar22[0xd] = auVar79[0xd] - (cVar52 == '/');
                auVar22[0xe] = auVar79[0xe] - (cVar53 == '/');
                auVar22[0xf] = auVar79[0xf] - (cVar54 == '/');
                auVar22 = pshufb(auVar21,auVar22);
                auVar23[0] = auVar22[0] + cVar78;
                auVar23[1] = auVar22[1] + cVar40;
                auVar23[2] = auVar22[2] + cVar41;
                auVar23[3] = auVar22[3] + cVar42;
                auVar23[4] = auVar22[4] + cVar43;
                auVar23[5] = auVar22[5] + cVar44;
                auVar23[6] = auVar22[6] + cVar45;
                auVar23[7] = auVar22[7] + cVar46;
                auVar23[8] = auVar22[8] + cVar47;
                auVar23[9] = auVar22[9] + cVar48;
                auVar23[10] = auVar22[10] + cVar49;
                auVar23[0xb] = auVar22[0xb] + cVar50;
                auVar23[0xc] = auVar22[0xc] + cVar51;
                auVar23[0xd] = auVar22[0xd] + cVar52;
                auVar23[0xe] = auVar22[0xe] + cVar53;
                auVar23[0xf] = auVar22[0xf] + cVar54;
                auVar22 = pmaddubsw(auVar23,_DAT_0010d050);
                auVar22 = pmaddwd(auVar22,_DAT_0010d060);
                auVar22 = pshufb(auVar22,_DAT_0010d070);
                *(undefined1 (*) [16])out = auVar22;
              }
              else {
                if ((((((((((((((((auVar93 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                                 (auVar93 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                                || (auVar93 >> 0x17 & (undefined1  [16])0x1) !=
                                   (undefined1  [16])0x0) ||
                               (auVar93 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                              || (auVar93 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                             || (auVar93 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                            || (auVar93 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                           || (auVar93 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar93 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar93 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar93 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar93 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar93 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar93 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar93 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) || bVar12)
                goto LAB_00105669;
                auVar81[0] = auVar79[0] - (cVar78 == cVar24);
                auVar81[1] = auVar79[1] - (cVar40 == cVar25);
                auVar81[2] = auVar79[2] - (cVar41 == cVar26);
                auVar81[3] = auVar79[3] - (cVar42 == cVar27);
                auVar81[4] = auVar79[4] - (cVar43 == cVar28);
                auVar81[5] = auVar79[5] - (cVar44 == cVar29);
                auVar81[6] = auVar79[6] - (cVar45 == cVar30);
                auVar81[7] = auVar79[7] - (cVar46 == cVar31);
                auVar81[8] = auVar79[8] - (cVar47 == cVar32);
                auVar81[9] = auVar79[9] - (cVar48 == cVar33);
                auVar81[10] = auVar79[10] - (cVar49 == cVar34);
                auVar81[0xb] = auVar79[0xb] - (cVar50 == cVar35);
                auVar81[0xc] = auVar79[0xc] - (cVar51 == cVar36);
                auVar81[0xd] = auVar79[0xd] - (cVar52 == cVar37);
                auVar81[0xe] = auVar79[0xe] - (cVar53 == cVar38);
                auVar81[0xf] = auVar79[0xf] - (cVar54 == cVar39);
                auVar81 = pshufb(auVar21,auVar81);
                auVar91[0] = auVar81[0] + cVar78;
                auVar91[1] = auVar81[1] + cVar40;
                auVar91[2] = auVar81[2] + cVar41;
                auVar91[3] = auVar81[3] + cVar42;
                auVar91[4] = auVar81[4] + cVar43;
                auVar91[5] = auVar81[5] + cVar44;
                auVar91[6] = auVar81[6] + cVar45;
                auVar91[7] = auVar81[7] + cVar46;
                auVar91[8] = auVar81[8] + cVar47;
                auVar91[9] = auVar81[9] + cVar48;
                auVar91[10] = auVar81[10] + cVar49;
                auVar91[0xb] = auVar81[0xb] + cVar50;
                auVar91[0xc] = auVar81[0xc] + cVar51;
                auVar91[0xd] = auVar81[0xd] + cVar52;
                auVar91[0xe] = auVar81[0xe] + cVar53;
                auVar91[0xf] = auVar81[0xf] + cVar54;
                auVar81 = pmaddubsw(auVar91,auVar5);
                auVar81 = pmaddwd(auVar81,auVar6);
                auVar81 = pshufb(auVar81,auVar7);
                *(undefined1 (*) [16])out = auVar81;
                pauVar10 = (undefined1 (*) [16])(*(undefined1 (*) [16])out + 0xc);
                auVar81 = *(undefined1 (*) [16])((long)src + 0x10);
                pauVar14 = (undefined1 (*) [16])((long)src + 0x10);
                auVar106._0_4_ = auVar81._0_4_ >> 4;
                auVar106._4_4_ = auVar81._4_4_ >> 4;
                auVar106._8_4_ = auVar81._8_4_ >> 4;
                auVar106._12_4_ = auVar81._12_4_ >> 4;
                auVar69 = auVar106 & auVar22;
                auVar79 = pshufb(auVar23,auVar69);
                auVar93 = pshufb(auVar4,auVar81 & auVar3);
                auVar93 = auVar93 & auVar79;
                auVar107[0] = -('\0' < auVar93[0]);
                auVar107[1] = -('\0' < auVar93[1]);
                auVar107[2] = -('\0' < auVar93[2]);
                auVar107[3] = -('\0' < auVar93[3]);
                auVar107[4] = -('\0' < auVar93[4]);
                auVar107[5] = -('\0' < auVar93[5]);
                auVar107[6] = -('\0' < auVar93[6]);
                auVar107[7] = -('\0' < auVar93[7]);
                auVar107[8] = -('\0' < auVar93[8]);
                auVar107[9] = -('\0' < auVar93[9]);
                auVar107[10] = -('\0' < auVar93[10]);
                auVar107[0xb] = -('\0' < auVar93[0xb]);
                auVar107[0xc] = -('\0' < auVar93[0xc]);
                auVar107[0xd] = -('\0' < auVar93[0xd]);
                auVar107[0xe] = -('\0' < auVar93[0xe]);
                bVar12 = '\0' < auVar93[0xf];
                auVar107[0xf] = -bVar12;
                lVar20 = -2;
                if ((((((((((((((((auVar107 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0
                                 && (auVar107 >> 0xf & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0) &&
                                (auVar107 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
                               && (auVar107 >> 0x1f & (undefined1  [16])0x1) ==
                                  (undefined1  [16])0x0) &&
                              (auVar107 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
                             && (auVar107 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0)
                            && (auVar107 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
                           && (auVar107 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0)
                          && (auVar107 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                         (auVar107 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar107 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                       (auVar107 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (auVar107 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     (auVar107 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar107 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) && !bVar12)
                goto LAB_001055bd;
              }
            }
            else {
              auVar81 = *(undefined1 (*) [16])src;
              auVar70._0_4_ = auVar81._0_4_ >> 4;
              auVar70._4_4_ = auVar81._4_4_ >> 4;
              auVar70._8_4_ = auVar81._8_4_ >> 4;
              auVar70._12_4_ = auVar81._12_4_ >> 4;
              auVar70 = auVar70 & auVar22;
              auVar79 = pshufb(auVar23,auVar70);
              auVar93 = pshufb(auVar4,auVar81 & auVar3);
              auVar93 = auVar93 & auVar79;
              auVar102[0] = -('\0' < auVar93[0]);
              auVar102[1] = -('\0' < auVar93[1]);
              auVar102[2] = -('\0' < auVar93[2]);
              auVar102[3] = -('\0' < auVar93[3]);
              auVar102[4] = -('\0' < auVar93[4]);
              auVar102[5] = -('\0' < auVar93[5]);
              auVar102[6] = -('\0' < auVar93[6]);
              auVar102[7] = -('\0' < auVar93[7]);
              auVar102[8] = -('\0' < auVar93[8]);
              auVar102[9] = -('\0' < auVar93[9]);
              auVar102[10] = -('\0' < auVar93[10]);
              auVar102[0xb] = -('\0' < auVar93[0xb]);
              auVar102[0xc] = -('\0' < auVar93[0xc]);
              auVar102[0xd] = -('\0' < auVar93[0xd]);
              auVar102[0xe] = -('\0' < auVar93[0xe]);
              bVar12 = '\0' < auVar93[0xf];
              auVar102[0xf] = -bVar12;
              if ((((((((((((((((auVar102 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                               (auVar102 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                              || (auVar102 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0
                              ) || (auVar102 >> 0x1f & (undefined1  [16])0x1) !=
                                   (undefined1  [16])0x0) ||
                            (auVar102 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                           (auVar102 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar102 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar102 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar102 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar102 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar102 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar102 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar102 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar102 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar102 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) || bVar12)
              goto LAB_00105669;
              auVar71[0] = auVar70[0] - (auVar81[0] == cVar24);
              auVar71[1] = auVar70[1] - (auVar81[1] == cVar25);
              auVar71[2] = auVar70[2] - (auVar81[2] == cVar26);
              auVar71[3] = auVar70[3] - (auVar81[3] == cVar27);
              auVar71[4] = auVar70[4] - (auVar81[4] == cVar28);
              auVar71[5] = auVar70[5] - (auVar81[5] == cVar29);
              auVar71[6] = auVar70[6] - (auVar81[6] == cVar30);
              auVar71[7] = auVar70[7] - (auVar81[7] == cVar31);
              auVar71[8] = auVar70[8] - (auVar81[8] == cVar32);
              auVar71[9] = auVar70[9] - (auVar81[9] == cVar33);
              auVar71[10] = auVar70[10] - (auVar81[10] == cVar34);
              auVar71[0xb] = auVar70[0xb] - (auVar81[0xb] == cVar35);
              auVar71[0xc] = auVar70[0xc] - (auVar81[0xc] == cVar36);
              auVar71[0xd] = auVar70[0xd] - (auVar81[0xd] == cVar37);
              auVar71[0xe] = auVar70[0xe] - (auVar81[0xe] == cVar38);
              auVar71[0xf] = auVar70[0xf] - (auVar81[0xf] == cVar39);
              auVar79 = pshufb(auVar21,auVar71);
              auVar88[0] = auVar79[0] + auVar81[0];
              auVar88[1] = auVar79[1] + auVar81[1];
              auVar88[2] = auVar79[2] + auVar81[2];
              auVar88[3] = auVar79[3] + auVar81[3];
              auVar88[4] = auVar79[4] + auVar81[4];
              auVar88[5] = auVar79[5] + auVar81[5];
              auVar88[6] = auVar79[6] + auVar81[6];
              auVar88[7] = auVar79[7] + auVar81[7];
              auVar88[8] = auVar79[8] + auVar81[8];
              auVar88[9] = auVar79[9] + auVar81[9];
              auVar88[10] = auVar79[10] + auVar81[10];
              auVar88[0xb] = auVar79[0xb] + auVar81[0xb];
              auVar88[0xc] = auVar79[0xc] + auVar81[0xc];
              auVar88[0xd] = auVar79[0xd] + auVar81[0xd];
              auVar88[0xe] = auVar79[0xe] + auVar81[0xe];
              auVar88[0xf] = auVar79[0xf] + auVar81[0xf];
              auVar81 = pmaddubsw(auVar88,auVar5);
              auVar81 = pmaddwd(auVar81,auVar6);
              auVar81 = pshufb(auVar81,auVar7);
              *(undefined1 (*) [16])out = auVar81;
              auVar81 = *(undefined1 (*) [16])((long)src + 0x10);
              auVar72._0_4_ = auVar81._0_4_ >> 4;
              auVar72._4_4_ = auVar81._4_4_ >> 4;
              auVar72._8_4_ = auVar81._8_4_ >> 4;
              auVar72._12_4_ = auVar81._12_4_ >> 4;
              auVar72 = auVar72 & auVar22;
              auVar79 = pshufb(auVar23,auVar72);
              auVar93 = pshufb(auVar4,auVar81 & auVar3);
              auVar93 = auVar93 & auVar79;
              auVar103[0] = -('\0' < auVar93[0]);
              auVar103[1] = -('\0' < auVar93[1]);
              auVar103[2] = -('\0' < auVar93[2]);
              auVar103[3] = -('\0' < auVar93[3]);
              auVar103[4] = -('\0' < auVar93[4]);
              auVar103[5] = -('\0' < auVar93[5]);
              auVar103[6] = -('\0' < auVar93[6]);
              auVar103[7] = -('\0' < auVar93[7]);
              auVar103[8] = -('\0' < auVar93[8]);
              auVar103[9] = -('\0' < auVar93[9]);
              auVar103[10] = -('\0' < auVar93[10]);
              auVar103[0xb] = -('\0' < auVar93[0xb]);
              auVar103[0xc] = -('\0' < auVar93[0xc]);
              auVar103[0xd] = -('\0' < auVar93[0xd]);
              auVar103[0xe] = -('\0' < auVar93[0xe]);
              bVar12 = '\0' < auVar93[0xf];
              auVar103[0xf] = -bVar12;
              if ((((((((((((((((auVar103 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                               (auVar103 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0)
                              && (auVar103 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0
                              ) && (auVar103 >> 0x1f & (undefined1  [16])0x1) ==
                                   (undefined1  [16])0x0) &&
                            (auVar103 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                           (auVar103 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar103 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                         (auVar103 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar103 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                       (auVar103 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (auVar103 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     (auVar103 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar103 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                   (auVar103 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar103 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) && !bVar12) {
                auVar73[0] = auVar72[0] - (auVar81[0] == cVar24);
                auVar73[1] = auVar72[1] - (auVar81[1] == cVar25);
                auVar73[2] = auVar72[2] - (auVar81[2] == cVar26);
                auVar73[3] = auVar72[3] - (auVar81[3] == cVar27);
                auVar73[4] = auVar72[4] - (auVar81[4] == cVar28);
                auVar73[5] = auVar72[5] - (auVar81[5] == cVar29);
                auVar73[6] = auVar72[6] - (auVar81[6] == cVar30);
                auVar73[7] = auVar72[7] - (auVar81[7] == cVar31);
                auVar73[8] = auVar72[8] - (auVar81[8] == cVar32);
                auVar73[9] = auVar72[9] - (auVar81[9] == cVar33);
                auVar73[10] = auVar72[10] - (auVar81[10] == cVar34);
                auVar73[0xb] = auVar72[0xb] - (auVar81[0xb] == cVar35);
                auVar73[0xc] = auVar72[0xc] - (auVar81[0xc] == cVar36);
                auVar73[0xd] = auVar72[0xd] - (auVar81[0xd] == cVar37);
                auVar73[0xe] = auVar72[0xe] - (auVar81[0xe] == cVar38);
                auVar73[0xf] = auVar72[0xf] - (auVar81[0xf] == cVar39);
                auVar79 = pshufb(auVar21,auVar73);
                auVar89[0] = auVar79[0] + auVar81[0];
                auVar89[1] = auVar79[1] + auVar81[1];
                auVar89[2] = auVar79[2] + auVar81[2];
                auVar89[3] = auVar79[3] + auVar81[3];
                auVar89[4] = auVar79[4] + auVar81[4];
                auVar89[5] = auVar79[5] + auVar81[5];
                auVar89[6] = auVar79[6] + auVar81[6];
                auVar89[7] = auVar79[7] + auVar81[7];
                auVar89[8] = auVar79[8] + auVar81[8];
                auVar89[9] = auVar79[9] + auVar81[9];
                auVar89[10] = auVar79[10] + auVar81[10];
                auVar89[0xb] = auVar79[0xb] + auVar81[0xb];
                auVar89[0xc] = auVar79[0xc] + auVar81[0xc];
                auVar89[0xd] = auVar79[0xd] + auVar81[0xd];
                auVar89[0xe] = auVar79[0xe] + auVar81[0xe];
                auVar89[0xf] = auVar79[0xf] + auVar81[0xf];
                auVar81 = pmaddubsw(auVar89,auVar5);
                auVar81 = pmaddwd(auVar81,auVar6);
                auVar81 = pshufb(auVar81,auVar7);
                *(undefined1 (*) [16])(*(undefined1 (*) [16])out + 0xc) = auVar81;
                auVar81 = *(undefined1 (*) [16])((long)src + 0x20);
                auVar74._0_4_ = auVar81._0_4_ >> 4;
                auVar74._4_4_ = auVar81._4_4_ >> 4;
                auVar74._8_4_ = auVar81._8_4_ >> 4;
                auVar74._12_4_ = auVar81._12_4_ >> 4;
                auVar74 = auVar74 & auVar22;
                auVar79 = pshufb(auVar23,auVar74);
                auVar93 = pshufb(auVar4,auVar81 & auVar3);
                auVar93 = auVar93 & auVar79;
                auVar104[0] = -('\0' < auVar93[0]);
                auVar104[1] = -('\0' < auVar93[1]);
                auVar104[2] = -('\0' < auVar93[2]);
                auVar104[3] = -('\0' < auVar93[3]);
                auVar104[4] = -('\0' < auVar93[4]);
                auVar104[5] = -('\0' < auVar93[5]);
                auVar104[6] = -('\0' < auVar93[6]);
                auVar104[7] = -('\0' < auVar93[7]);
                auVar104[8] = -('\0' < auVar93[8]);
                auVar104[9] = -('\0' < auVar93[9]);
                auVar104[10] = -('\0' < auVar93[10]);
                auVar104[0xb] = -('\0' < auVar93[0xb]);
                auVar104[0xc] = -('\0' < auVar93[0xc]);
                auVar104[0xd] = -('\0' < auVar93[0xd]);
                auVar104[0xe] = -('\0' < auVar93[0xe]);
                bVar12 = '\0' < auVar93[0xf];
                auVar104[0xf] = -bVar12;
                if ((((((((((((((((auVar104 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0
                                 || (auVar104 >> 0xf & (undefined1  [16])0x1) !=
                                    (undefined1  [16])0x0) ||
                                (auVar104 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                               || (auVar104 >> 0x1f & (undefined1  [16])0x1) !=
                                  (undefined1  [16])0x0) ||
                              (auVar104 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                             || (auVar104 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                            || (auVar104 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                           || (auVar104 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                          || (auVar104 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar104 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar104 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar104 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar104 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar104 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar104 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) || bVar12)
                goto LAB_00105614;
                auVar75[0] = auVar74[0] - (auVar81[0] == cVar24);
                auVar75[1] = auVar74[1] - (auVar81[1] == cVar25);
                auVar75[2] = auVar74[2] - (auVar81[2] == cVar26);
                auVar75[3] = auVar74[3] - (auVar81[3] == cVar27);
                auVar75[4] = auVar74[4] - (auVar81[4] == cVar28);
                auVar75[5] = auVar74[5] - (auVar81[5] == cVar29);
                auVar75[6] = auVar74[6] - (auVar81[6] == cVar30);
                auVar75[7] = auVar74[7] - (auVar81[7] == cVar31);
                auVar75[8] = auVar74[8] - (auVar81[8] == cVar32);
                auVar75[9] = auVar74[9] - (auVar81[9] == cVar33);
                auVar75[10] = auVar74[10] - (auVar81[10] == cVar34);
                auVar75[0xb] = auVar74[0xb] - (auVar81[0xb] == cVar35);
                auVar75[0xc] = auVar74[0xc] - (auVar81[0xc] == cVar36);
                auVar75[0xd] = auVar74[0xd] - (auVar81[0xd] == cVar37);
                auVar75[0xe] = auVar74[0xe] - (auVar81[0xe] == cVar38);
                auVar75[0xf] = auVar74[0xf] - (auVar81[0xf] == cVar39);
                auVar79 = pshufb(auVar21,auVar75);
                auVar90[0] = auVar79[0] + auVar81[0];
                auVar90[1] = auVar79[1] + auVar81[1];
                auVar90[2] = auVar79[2] + auVar81[2];
                auVar90[3] = auVar79[3] + auVar81[3];
                auVar90[4] = auVar79[4] + auVar81[4];
                auVar90[5] = auVar79[5] + auVar81[5];
                auVar90[6] = auVar79[6] + auVar81[6];
                auVar90[7] = auVar79[7] + auVar81[7];
                auVar90[8] = auVar79[8] + auVar81[8];
                auVar90[9] = auVar79[9] + auVar81[9];
                auVar90[10] = auVar79[10] + auVar81[10];
                auVar90[0xb] = auVar79[0xb] + auVar81[0xb];
                auVar90[0xc] = auVar79[0xc] + auVar81[0xc];
                auVar90[0xd] = auVar79[0xd] + auVar81[0xd];
                auVar90[0xe] = auVar79[0xe] + auVar81[0xe];
                auVar90[0xf] = auVar79[0xf] + auVar81[0xf];
                auVar81 = pmaddubsw(auVar90,auVar5);
                auVar81 = pmaddwd(auVar81,auVar6);
                auVar81 = pshufb(auVar81,auVar7);
                *(undefined1 (*) [16])(*(undefined1 (*) [16])((long)out + 0x10) + 8) = auVar81;
                pauVar10 = (undefined1 (*) [16])(*(undefined1 (*) [16])((long)out + 0x20) + 4);
                auVar81 = *(undefined1 (*) [16])((long)src + 0x30);
                pauVar14 = (undefined1 (*) [16])((long)src + 0x30);
                auVar76._0_4_ = auVar81._0_4_ >> 4;
                auVar76._4_4_ = auVar81._4_4_ >> 4;
                auVar76._8_4_ = auVar81._8_4_ >> 4;
                auVar76._12_4_ = auVar81._12_4_ >> 4;
                auVar69 = auVar76 & auVar22;
                auVar79 = pshufb(auVar23,auVar69);
                auVar93 = pshufb(auVar4,auVar81 & auVar3);
                auVar93 = auVar93 & auVar79;
                auVar105[0] = -('\0' < auVar93[0]);
                auVar105[1] = -('\0' < auVar93[1]);
                auVar105[2] = -('\0' < auVar93[2]);
                auVar105[3] = -('\0' < auVar93[3]);
                auVar105[4] = -('\0' < auVar93[4]);
                auVar105[5] = -('\0' < auVar93[5]);
                auVar105[6] = -('\0' < auVar93[6]);
                auVar105[7] = -('\0' < auVar93[7]);
                auVar105[8] = -('\0' < auVar93[8]);
                auVar105[9] = -('\0' < auVar93[9]);
                auVar105[10] = -('\0' < auVar93[10]);
                auVar105[0xb] = -('\0' < auVar93[0xb]);
                auVar105[0xc] = -('\0' < auVar93[0xc]);
                auVar105[0xd] = -('\0' < auVar93[0xd]);
                auVar105[0xe] = -('\0' < auVar93[0xe]);
                bVar12 = '\0' < auVar93[0xf];
                auVar105[0xf] = -bVar12;
                lVar20 = -4;
                if ((((((((((((((((auVar105 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0
                                 || (auVar105 >> 0xf & (undefined1  [16])0x1) !=
                                    (undefined1  [16])0x0) ||
                                (auVar105 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                               || (auVar105 >> 0x1f & (undefined1  [16])0x1) !=
                                  (undefined1  [16])0x0) ||
                              (auVar105 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                             || (auVar105 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                            || (auVar105 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                           || (auVar105 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                          || (auVar105 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar105 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar105 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar105 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar105 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar105 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar105 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) || bVar12)
                goto LAB_0010562a;
                goto LAB_001055bd;
              }
            }
LAB_0010560f:
            src = (char *)((long)src + 0x10);
            out = *(undefined1 (*) [16])out + 0xc;
            uVar13 = uVar13 - 1;
            goto LAB_00105669;
          }
          auVar81 = *(undefined1 (*) [16])src;
          auVar55._0_4_ = auVar81._0_4_ >> 4;
          auVar55._4_4_ = auVar81._4_4_ >> 4;
          auVar55._8_4_ = auVar81._8_4_ >> 4;
          auVar55._12_4_ = auVar81._12_4_ >> 4;
          auVar55 = auVar55 & auVar22;
          auVar79 = pshufb(auVar23,auVar55);
          auVar93 = pshufb(auVar4,auVar81 & auVar3);
          auVar93 = auVar93 & auVar79;
          auVar94[0] = -('\0' < auVar93[0]);
          auVar94[1] = -('\0' < auVar93[1]);
          auVar94[2] = -('\0' < auVar93[2]);
          auVar94[3] = -('\0' < auVar93[3]);
          auVar94[4] = -('\0' < auVar93[4]);
          auVar94[5] = -('\0' < auVar93[5]);
          auVar94[6] = -('\0' < auVar93[6]);
          auVar94[7] = -('\0' < auVar93[7]);
          auVar94[8] = -('\0' < auVar93[8]);
          auVar94[9] = -('\0' < auVar93[9]);
          auVar94[10] = -('\0' < auVar93[10]);
          auVar94[0xb] = -('\0' < auVar93[0xb]);
          auVar94[0xc] = -('\0' < auVar93[0xc]);
          auVar94[0xd] = -('\0' < auVar93[0xd]);
          auVar94[0xe] = -('\0' < auVar93[0xe]);
          bVar12 = '\0' < auVar93[0xf];
          auVar94[0xf] = -bVar12;
          if ((((((((((((((((auVar94 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                           (auVar94 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar94 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar94 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar94 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar94 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar94 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar94 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar94 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar94 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar94 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar94 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar94 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar94 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar94 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) || bVar12)
          goto LAB_00105669;
          auVar56[0] = auVar55[0] - (auVar81[0] == cVar24);
          auVar56[1] = auVar55[1] - (auVar81[1] == cVar25);
          auVar56[2] = auVar55[2] - (auVar81[2] == cVar26);
          auVar56[3] = auVar55[3] - (auVar81[3] == cVar27);
          auVar56[4] = auVar55[4] - (auVar81[4] == cVar28);
          auVar56[5] = auVar55[5] - (auVar81[5] == cVar29);
          auVar56[6] = auVar55[6] - (auVar81[6] == cVar30);
          auVar56[7] = auVar55[7] - (auVar81[7] == cVar31);
          auVar56[8] = auVar55[8] - (auVar81[8] == cVar32);
          auVar56[9] = auVar55[9] - (auVar81[9] == cVar33);
          auVar56[10] = auVar55[10] - (auVar81[10] == cVar34);
          auVar56[0xb] = auVar55[0xb] - (auVar81[0xb] == cVar35);
          auVar56[0xc] = auVar55[0xc] - (auVar81[0xc] == cVar36);
          auVar56[0xd] = auVar55[0xd] - (auVar81[0xd] == cVar37);
          auVar56[0xe] = auVar55[0xe] - (auVar81[0xe] == cVar38);
          auVar56[0xf] = auVar55[0xf] - (auVar81[0xf] == cVar39);
          auVar79 = pshufb(auVar21,auVar56);
          auVar80[0] = auVar79[0] + auVar81[0];
          auVar80[1] = auVar79[1] + auVar81[1];
          auVar80[2] = auVar79[2] + auVar81[2];
          auVar80[3] = auVar79[3] + auVar81[3];
          auVar80[4] = auVar79[4] + auVar81[4];
          auVar80[5] = auVar79[5] + auVar81[5];
          auVar80[6] = auVar79[6] + auVar81[6];
          auVar80[7] = auVar79[7] + auVar81[7];
          auVar80[8] = auVar79[8] + auVar81[8];
          auVar80[9] = auVar79[9] + auVar81[9];
          auVar80[10] = auVar79[10] + auVar81[10];
          auVar80[0xb] = auVar79[0xb] + auVar81[0xb];
          auVar80[0xc] = auVar79[0xc] + auVar81[0xc];
          auVar80[0xd] = auVar79[0xd] + auVar81[0xd];
          auVar80[0xe] = auVar79[0xe] + auVar81[0xe];
          auVar80[0xf] = auVar79[0xf] + auVar81[0xf];
          auVar81 = pmaddubsw(auVar80,auVar5);
          auVar81 = pmaddwd(auVar81,auVar6);
          auVar81 = pshufb(auVar81,auVar7);
          *(undefined1 (*) [16])out = auVar81;
          auVar81 = *(undefined1 (*) [16])((long)src + 0x10);
          auVar57._0_4_ = auVar81._0_4_ >> 4;
          auVar57._4_4_ = auVar81._4_4_ >> 4;
          auVar57._8_4_ = auVar81._8_4_ >> 4;
          auVar57._12_4_ = auVar81._12_4_ >> 4;
          auVar57 = auVar57 & auVar22;
          auVar79 = pshufb(auVar23,auVar57);
          auVar93 = pshufb(auVar4,auVar81 & auVar3);
          auVar93 = auVar93 & auVar79;
          auVar95[0] = -('\0' < auVar93[0]);
          auVar95[1] = -('\0' < auVar93[1]);
          auVar95[2] = -('\0' < auVar93[2]);
          auVar95[3] = -('\0' < auVar93[3]);
          auVar95[4] = -('\0' < auVar93[4]);
          auVar95[5] = -('\0' < auVar93[5]);
          auVar95[6] = -('\0' < auVar93[6]);
          auVar95[7] = -('\0' < auVar93[7]);
          auVar95[8] = -('\0' < auVar93[8]);
          auVar95[9] = -('\0' < auVar93[9]);
          auVar95[10] = -('\0' < auVar93[10]);
          auVar95[0xb] = -('\0' < auVar93[0xb]);
          auVar95[0xc] = -('\0' < auVar93[0xc]);
          auVar95[0xd] = -('\0' < auVar93[0xd]);
          auVar95[0xe] = -('\0' < auVar93[0xe]);
          bVar12 = '\0' < auVar93[0xf];
          auVar95[0xf] = -bVar12;
          if ((((((((((((((((auVar95 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                           (auVar95 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar95 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar95 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar95 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar95 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar95 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar95 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar95 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar95 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar95 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar95 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar95 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar95 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar95 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) || bVar12)
          goto LAB_0010560f;
          auVar58[0] = auVar57[0] - (auVar81[0] == cVar24);
          auVar58[1] = auVar57[1] - (auVar81[1] == cVar25);
          auVar58[2] = auVar57[2] - (auVar81[2] == cVar26);
          auVar58[3] = auVar57[3] - (auVar81[3] == cVar27);
          auVar58[4] = auVar57[4] - (auVar81[4] == cVar28);
          auVar58[5] = auVar57[5] - (auVar81[5] == cVar29);
          auVar58[6] = auVar57[6] - (auVar81[6] == cVar30);
          auVar58[7] = auVar57[7] - (auVar81[7] == cVar31);
          auVar58[8] = auVar57[8] - (auVar81[8] == cVar32);
          auVar58[9] = auVar57[9] - (auVar81[9] == cVar33);
          auVar58[10] = auVar57[10] - (auVar81[10] == cVar34);
          auVar58[0xb] = auVar57[0xb] - (auVar81[0xb] == cVar35);
          auVar58[0xc] = auVar57[0xc] - (auVar81[0xc] == cVar36);
          auVar58[0xd] = auVar57[0xd] - (auVar81[0xd] == cVar37);
          auVar58[0xe] = auVar57[0xe] - (auVar81[0xe] == cVar38);
          auVar58[0xf] = auVar57[0xf] - (auVar81[0xf] == cVar39);
          auVar79 = pshufb(auVar21,auVar58);
          auVar82[0] = auVar79[0] + auVar81[0];
          auVar82[1] = auVar79[1] + auVar81[1];
          auVar82[2] = auVar79[2] + auVar81[2];
          auVar82[3] = auVar79[3] + auVar81[3];
          auVar82[4] = auVar79[4] + auVar81[4];
          auVar82[5] = auVar79[5] + auVar81[5];
          auVar82[6] = auVar79[6] + auVar81[6];
          auVar82[7] = auVar79[7] + auVar81[7];
          auVar82[8] = auVar79[8] + auVar81[8];
          auVar82[9] = auVar79[9] + auVar81[9];
          auVar82[10] = auVar79[10] + auVar81[10];
          auVar82[0xb] = auVar79[0xb] + auVar81[0xb];
          auVar82[0xc] = auVar79[0xc] + auVar81[0xc];
          auVar82[0xd] = auVar79[0xd] + auVar81[0xd];
          auVar82[0xe] = auVar79[0xe] + auVar81[0xe];
          auVar82[0xf] = auVar79[0xf] + auVar81[0xf];
          auVar81 = pmaddubsw(auVar82,auVar5);
          auVar81 = pmaddwd(auVar81,auVar6);
          auVar81 = pshufb(auVar81,auVar7);
          *(undefined1 (*) [16])(*(undefined1 (*) [16])out + 0xc) = auVar81;
          auVar81 = *(undefined1 (*) [16])((long)src + 0x20);
          auVar59._0_4_ = auVar81._0_4_ >> 4;
          auVar59._4_4_ = auVar81._4_4_ >> 4;
          auVar59._8_4_ = auVar81._8_4_ >> 4;
          auVar59._12_4_ = auVar81._12_4_ >> 4;
          auVar59 = auVar59 & auVar22;
          auVar79 = pshufb(auVar23,auVar59);
          auVar93 = pshufb(auVar4,auVar81 & auVar3);
          auVar93 = auVar93 & auVar79;
          auVar96[0] = -('\0' < auVar93[0]);
          auVar96[1] = -('\0' < auVar93[1]);
          auVar96[2] = -('\0' < auVar93[2]);
          auVar96[3] = -('\0' < auVar93[3]);
          auVar96[4] = -('\0' < auVar93[4]);
          auVar96[5] = -('\0' < auVar93[5]);
          auVar96[6] = -('\0' < auVar93[6]);
          auVar96[7] = -('\0' < auVar93[7]);
          auVar96[8] = -('\0' < auVar93[8]);
          auVar96[9] = -('\0' < auVar93[9]);
          auVar96[10] = -('\0' < auVar93[10]);
          auVar96[0xb] = -('\0' < auVar93[0xb]);
          auVar96[0xc] = -('\0' < auVar93[0xc]);
          auVar96[0xd] = -('\0' < auVar93[0xd]);
          auVar96[0xe] = -('\0' < auVar93[0xe]);
          bVar12 = '\0' < auVar93[0xf];
          auVar96[0xf] = -bVar12;
          if ((((((((((((((((auVar96 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                           (auVar96 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar96 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar96 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar96 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar96 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar96 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar96 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar96 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar96 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar96 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar96 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar96 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar96 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar96 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) || bVar12) {
LAB_00105614:
            out = *(undefined1 (*) [16])((long)out + 0x10) + 8;
            src = (char *)((long)src + 0x20);
            uVar13 = uVar13 - 2;
            goto LAB_00105669;
          }
          auVar60[0] = auVar59[0] - (auVar81[0] == cVar24);
          auVar60[1] = auVar59[1] - (auVar81[1] == cVar25);
          auVar60[2] = auVar59[2] - (auVar81[2] == cVar26);
          auVar60[3] = auVar59[3] - (auVar81[3] == cVar27);
          auVar60[4] = auVar59[4] - (auVar81[4] == cVar28);
          auVar60[5] = auVar59[5] - (auVar81[5] == cVar29);
          auVar60[6] = auVar59[6] - (auVar81[6] == cVar30);
          auVar60[7] = auVar59[7] - (auVar81[7] == cVar31);
          auVar60[8] = auVar59[8] - (auVar81[8] == cVar32);
          auVar60[9] = auVar59[9] - (auVar81[9] == cVar33);
          auVar60[10] = auVar59[10] - (auVar81[10] == cVar34);
          auVar60[0xb] = auVar59[0xb] - (auVar81[0xb] == cVar35);
          auVar60[0xc] = auVar59[0xc] - (auVar81[0xc] == cVar36);
          auVar60[0xd] = auVar59[0xd] - (auVar81[0xd] == cVar37);
          auVar60[0xe] = auVar59[0xe] - (auVar81[0xe] == cVar38);
          auVar60[0xf] = auVar59[0xf] - (auVar81[0xf] == cVar39);
          auVar79 = pshufb(auVar21,auVar60);
          auVar83[0] = auVar79[0] + auVar81[0];
          auVar83[1] = auVar79[1] + auVar81[1];
          auVar83[2] = auVar79[2] + auVar81[2];
          auVar83[3] = auVar79[3] + auVar81[3];
          auVar83[4] = auVar79[4] + auVar81[4];
          auVar83[5] = auVar79[5] + auVar81[5];
          auVar83[6] = auVar79[6] + auVar81[6];
          auVar83[7] = auVar79[7] + auVar81[7];
          auVar83[8] = auVar79[8] + auVar81[8];
          auVar83[9] = auVar79[9] + auVar81[9];
          auVar83[10] = auVar79[10] + auVar81[10];
          auVar83[0xb] = auVar79[0xb] + auVar81[0xb];
          auVar83[0xc] = auVar79[0xc] + auVar81[0xc];
          auVar83[0xd] = auVar79[0xd] + auVar81[0xd];
          auVar83[0xe] = auVar79[0xe] + auVar81[0xe];
          auVar83[0xf] = auVar79[0xf] + auVar81[0xf];
          auVar81 = pmaddubsw(auVar83,auVar5);
          auVar81 = pmaddwd(auVar81,auVar6);
          auVar81 = pshufb(auVar81,auVar7);
          *(undefined1 (*) [16])(*(undefined1 (*) [16])((long)out + 0x10) + 8) = auVar81;
          auVar81 = *(undefined1 (*) [16])((long)src + 0x30);
          auVar61._0_4_ = auVar81._0_4_ >> 4;
          auVar61._4_4_ = auVar81._4_4_ >> 4;
          auVar61._8_4_ = auVar81._8_4_ >> 4;
          auVar61._12_4_ = auVar81._12_4_ >> 4;
          auVar61 = auVar61 & auVar22;
          auVar79 = pshufb(auVar23,auVar61);
          auVar93 = pshufb(auVar4,auVar81 & auVar3);
          auVar93 = auVar93 & auVar79;
          auVar97[0] = -('\0' < auVar93[0]);
          auVar97[1] = -('\0' < auVar93[1]);
          auVar97[2] = -('\0' < auVar93[2]);
          auVar97[3] = -('\0' < auVar93[3]);
          auVar97[4] = -('\0' < auVar93[4]);
          auVar97[5] = -('\0' < auVar93[5]);
          auVar97[6] = -('\0' < auVar93[6]);
          auVar97[7] = -('\0' < auVar93[7]);
          auVar97[8] = -('\0' < auVar93[8]);
          auVar97[9] = -('\0' < auVar93[9]);
          auVar97[10] = -('\0' < auVar93[10]);
          auVar97[0xb] = -('\0' < auVar93[0xb]);
          auVar97[0xc] = -('\0' < auVar93[0xc]);
          auVar97[0xd] = -('\0' < auVar93[0xd]);
          auVar97[0xe] = -('\0' < auVar93[0xe]);
          bVar12 = '\0' < auVar93[0xf];
          auVar97[0xf] = -bVar12;
          if ((((((((((((((((auVar97 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                           (auVar97 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar97 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar97 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar97 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar97 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar97 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar97 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar97 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar97 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar97 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar97 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar97 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar97 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar97 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) || bVar12) {
LAB_0010562a:
            src = (char *)((long)src + 0x30);
            out = *(undefined1 (*) [16])((long)out + 0x20) + 4;
            uVar13 = uVar13 - 3;
            goto LAB_00105669;
          }
          auVar62[0] = auVar61[0] - (auVar81[0] == cVar24);
          auVar62[1] = auVar61[1] - (auVar81[1] == cVar25);
          auVar62[2] = auVar61[2] - (auVar81[2] == cVar26);
          auVar62[3] = auVar61[3] - (auVar81[3] == cVar27);
          auVar62[4] = auVar61[4] - (auVar81[4] == cVar28);
          auVar62[5] = auVar61[5] - (auVar81[5] == cVar29);
          auVar62[6] = auVar61[6] - (auVar81[6] == cVar30);
          auVar62[7] = auVar61[7] - (auVar81[7] == cVar31);
          auVar62[8] = auVar61[8] - (auVar81[8] == cVar32);
          auVar62[9] = auVar61[9] - (auVar81[9] == cVar33);
          auVar62[10] = auVar61[10] - (auVar81[10] == cVar34);
          auVar62[0xb] = auVar61[0xb] - (auVar81[0xb] == cVar35);
          auVar62[0xc] = auVar61[0xc] - (auVar81[0xc] == cVar36);
          auVar62[0xd] = auVar61[0xd] - (auVar81[0xd] == cVar37);
          auVar62[0xe] = auVar61[0xe] - (auVar81[0xe] == cVar38);
          auVar62[0xf] = auVar61[0xf] - (auVar81[0xf] == cVar39);
          auVar79 = pshufb(auVar21,auVar62);
          auVar84[0] = auVar79[0] + auVar81[0];
          auVar84[1] = auVar79[1] + auVar81[1];
          auVar84[2] = auVar79[2] + auVar81[2];
          auVar84[3] = auVar79[3] + auVar81[3];
          auVar84[4] = auVar79[4] + auVar81[4];
          auVar84[5] = auVar79[5] + auVar81[5];
          auVar84[6] = auVar79[6] + auVar81[6];
          auVar84[7] = auVar79[7] + auVar81[7];
          auVar84[8] = auVar79[8] + auVar81[8];
          auVar84[9] = auVar79[9] + auVar81[9];
          auVar84[10] = auVar79[10] + auVar81[10];
          auVar84[0xb] = auVar79[0xb] + auVar81[0xb];
          auVar84[0xc] = auVar79[0xc] + auVar81[0xc];
          auVar84[0xd] = auVar79[0xd] + auVar81[0xd];
          auVar84[0xe] = auVar79[0xe] + auVar81[0xe];
          auVar84[0xf] = auVar79[0xf] + auVar81[0xf];
          auVar81 = pmaddubsw(auVar84,auVar5);
          auVar81 = pmaddwd(auVar81,auVar6);
          auVar81 = pshufb(auVar81,auVar7);
          *(undefined1 (*) [16])(*(undefined1 (*) [16])((long)out + 0x20) + 4) = auVar81;
          auVar81 = *(undefined1 (*) [16])((long)src + 0x40);
          auVar63._0_4_ = auVar81._0_4_ >> 4;
          auVar63._4_4_ = auVar81._4_4_ >> 4;
          auVar63._8_4_ = auVar81._8_4_ >> 4;
          auVar63._12_4_ = auVar81._12_4_ >> 4;
          auVar63 = auVar63 & auVar22;
          auVar79 = pshufb(auVar23,auVar63);
          auVar93 = pshufb(auVar4,auVar81 & auVar3);
          auVar93 = auVar93 & auVar79;
          auVar98[0] = -('\0' < auVar93[0]);
          auVar98[1] = -('\0' < auVar93[1]);
          auVar98[2] = -('\0' < auVar93[2]);
          auVar98[3] = -('\0' < auVar93[3]);
          auVar98[4] = -('\0' < auVar93[4]);
          auVar98[5] = -('\0' < auVar93[5]);
          auVar98[6] = -('\0' < auVar93[6]);
          auVar98[7] = -('\0' < auVar93[7]);
          auVar98[8] = -('\0' < auVar93[8]);
          auVar98[9] = -('\0' < auVar93[9]);
          auVar98[10] = -('\0' < auVar93[10]);
          auVar98[0xb] = -('\0' < auVar93[0xb]);
          auVar98[0xc] = -('\0' < auVar93[0xc]);
          auVar98[0xd] = -('\0' < auVar93[0xd]);
          auVar98[0xe] = -('\0' < auVar93[0xe]);
          bVar12 = '\0' < auVar93[0xf];
          auVar98[0xf] = -bVar12;
          if ((((((((((((((((auVar98 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                           (auVar98 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar98 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar98 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar98 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar98 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar98 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar98 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar98 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar98 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar98 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar98 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar98 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar98 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar98 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) || bVar12) {
            out = (char *)((long)out + 0x30);
            src = (char *)((long)src + 0x40);
            uVar13 = uVar13 - 4;
            goto LAB_00105669;
          }
          auVar64[0] = auVar63[0] - (auVar81[0] == cVar24);
          auVar64[1] = auVar63[1] - (auVar81[1] == cVar25);
          auVar64[2] = auVar63[2] - (auVar81[2] == cVar26);
          auVar64[3] = auVar63[3] - (auVar81[3] == cVar27);
          auVar64[4] = auVar63[4] - (auVar81[4] == cVar28);
          auVar64[5] = auVar63[5] - (auVar81[5] == cVar29);
          auVar64[6] = auVar63[6] - (auVar81[6] == cVar30);
          auVar64[7] = auVar63[7] - (auVar81[7] == cVar31);
          auVar64[8] = auVar63[8] - (auVar81[8] == cVar32);
          auVar64[9] = auVar63[9] - (auVar81[9] == cVar33);
          auVar64[10] = auVar63[10] - (auVar81[10] == cVar34);
          auVar64[0xb] = auVar63[0xb] - (auVar81[0xb] == cVar35);
          auVar64[0xc] = auVar63[0xc] - (auVar81[0xc] == cVar36);
          auVar64[0xd] = auVar63[0xd] - (auVar81[0xd] == cVar37);
          auVar64[0xe] = auVar63[0xe] - (auVar81[0xe] == cVar38);
          auVar64[0xf] = auVar63[0xf] - (auVar81[0xf] == cVar39);
          auVar79 = pshufb(auVar21,auVar64);
          auVar85[0] = auVar79[0] + auVar81[0];
          auVar85[1] = auVar79[1] + auVar81[1];
          auVar85[2] = auVar79[2] + auVar81[2];
          auVar85[3] = auVar79[3] + auVar81[3];
          auVar85[4] = auVar79[4] + auVar81[4];
          auVar85[5] = auVar79[5] + auVar81[5];
          auVar85[6] = auVar79[6] + auVar81[6];
          auVar85[7] = auVar79[7] + auVar81[7];
          auVar85[8] = auVar79[8] + auVar81[8];
          auVar85[9] = auVar79[9] + auVar81[9];
          auVar85[10] = auVar79[10] + auVar81[10];
          auVar85[0xb] = auVar79[0xb] + auVar81[0xb];
          auVar85[0xc] = auVar79[0xc] + auVar81[0xc];
          auVar85[0xd] = auVar79[0xd] + auVar81[0xd];
          auVar85[0xe] = auVar79[0xe] + auVar81[0xe];
          auVar85[0xf] = auVar79[0xf] + auVar81[0xf];
          auVar81 = pmaddubsw(auVar85,auVar5);
          auVar81 = pmaddwd(auVar81,auVar6);
          auVar81 = pshufb(auVar81,auVar7);
          *(undefined1 (*) [16])((long)out + 0x30) = auVar81;
          auVar81 = *(undefined1 (*) [16])((long)src + 0x50);
          auVar65._0_4_ = auVar81._0_4_ >> 4;
          auVar65._4_4_ = auVar81._4_4_ >> 4;
          auVar65._8_4_ = auVar81._8_4_ >> 4;
          auVar65._12_4_ = auVar81._12_4_ >> 4;
          auVar65 = auVar65 & auVar22;
          auVar79 = pshufb(auVar23,auVar65);
          auVar93 = pshufb(auVar4,auVar81 & auVar3);
          auVar93 = auVar93 & auVar79;
          auVar99[0] = -('\0' < auVar93[0]);
          auVar99[1] = -('\0' < auVar93[1]);
          auVar99[2] = -('\0' < auVar93[2]);
          auVar99[3] = -('\0' < auVar93[3]);
          auVar99[4] = -('\0' < auVar93[4]);
          auVar99[5] = -('\0' < auVar93[5]);
          auVar99[6] = -('\0' < auVar93[6]);
          auVar99[7] = -('\0' < auVar93[7]);
          auVar99[8] = -('\0' < auVar93[8]);
          auVar99[9] = -('\0' < auVar93[9]);
          auVar99[10] = -('\0' < auVar93[10]);
          auVar99[0xb] = -('\0' < auVar93[0xb]);
          auVar99[0xc] = -('\0' < auVar93[0xc]);
          auVar99[0xd] = -('\0' < auVar93[0xd]);
          auVar99[0xe] = -('\0' < auVar93[0xe]);
          bVar12 = '\0' < auVar93[0xf];
          auVar99[0xf] = -bVar12;
          if ((((((((((((((((auVar99 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                           (auVar99 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar99 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar99 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar99 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar99 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar99 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar99 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar99 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar99 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar99 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar99 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar99 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar99 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar99 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) || bVar12) {
            out = *(undefined1 (*) [16])((long)out + 0x30) + 0xc;
            src = (char *)((long)src + 0x50);
            uVar13 = uVar13 - 5;
            goto LAB_00105669;
          }
          auVar66[0] = auVar65[0] - (auVar81[0] == cVar24);
          auVar66[1] = auVar65[1] - (auVar81[1] == cVar25);
          auVar66[2] = auVar65[2] - (auVar81[2] == cVar26);
          auVar66[3] = auVar65[3] - (auVar81[3] == cVar27);
          auVar66[4] = auVar65[4] - (auVar81[4] == cVar28);
          auVar66[5] = auVar65[5] - (auVar81[5] == cVar29);
          auVar66[6] = auVar65[6] - (auVar81[6] == cVar30);
          auVar66[7] = auVar65[7] - (auVar81[7] == cVar31);
          auVar66[8] = auVar65[8] - (auVar81[8] == cVar32);
          auVar66[9] = auVar65[9] - (auVar81[9] == cVar33);
          auVar66[10] = auVar65[10] - (auVar81[10] == cVar34);
          auVar66[0xb] = auVar65[0xb] - (auVar81[0xb] == cVar35);
          auVar66[0xc] = auVar65[0xc] - (auVar81[0xc] == cVar36);
          auVar66[0xd] = auVar65[0xd] - (auVar81[0xd] == cVar37);
          auVar66[0xe] = auVar65[0xe] - (auVar81[0xe] == cVar38);
          auVar66[0xf] = auVar65[0xf] - (auVar81[0xf] == cVar39);
          auVar79 = pshufb(auVar21,auVar66);
          auVar86[0] = auVar79[0] + auVar81[0];
          auVar86[1] = auVar79[1] + auVar81[1];
          auVar86[2] = auVar79[2] + auVar81[2];
          auVar86[3] = auVar79[3] + auVar81[3];
          auVar86[4] = auVar79[4] + auVar81[4];
          auVar86[5] = auVar79[5] + auVar81[5];
          auVar86[6] = auVar79[6] + auVar81[6];
          auVar86[7] = auVar79[7] + auVar81[7];
          auVar86[8] = auVar79[8] + auVar81[8];
          auVar86[9] = auVar79[9] + auVar81[9];
          auVar86[10] = auVar79[10] + auVar81[10];
          auVar86[0xb] = auVar79[0xb] + auVar81[0xb];
          auVar86[0xc] = auVar79[0xc] + auVar81[0xc];
          auVar86[0xd] = auVar79[0xd] + auVar81[0xd];
          auVar86[0xe] = auVar79[0xe] + auVar81[0xe];
          auVar86[0xf] = auVar79[0xf] + auVar81[0xf];
          auVar81 = pmaddubsw(auVar86,auVar5);
          auVar81 = pmaddwd(auVar81,auVar6);
          auVar81 = pshufb(auVar81,auVar7);
          *(undefined1 (*) [16])(*(undefined1 (*) [16])((long)out + 0x30) + 0xc) = auVar81;
          auVar81 = *(undefined1 (*) [16])((long)src + 0x60);
          auVar67._0_4_ = auVar81._0_4_ >> 4;
          auVar67._4_4_ = auVar81._4_4_ >> 4;
          auVar67._8_4_ = auVar81._8_4_ >> 4;
          auVar67._12_4_ = auVar81._12_4_ >> 4;
          auVar67 = auVar67 & auVar22;
          auVar79 = pshufb(auVar23,auVar67);
          auVar93 = pshufb(auVar4,auVar81 & auVar3);
          auVar93 = auVar93 & auVar79;
          auVar100[0] = -('\0' < auVar93[0]);
          auVar100[1] = -('\0' < auVar93[1]);
          auVar100[2] = -('\0' < auVar93[2]);
          auVar100[3] = -('\0' < auVar93[3]);
          auVar100[4] = -('\0' < auVar93[4]);
          auVar100[5] = -('\0' < auVar93[5]);
          auVar100[6] = -('\0' < auVar93[6]);
          auVar100[7] = -('\0' < auVar93[7]);
          auVar100[8] = -('\0' < auVar93[8]);
          auVar100[9] = -('\0' < auVar93[9]);
          auVar100[10] = -('\0' < auVar93[10]);
          auVar100[0xb] = -('\0' < auVar93[0xb]);
          auVar100[0xc] = -('\0' < auVar93[0xc]);
          auVar100[0xd] = -('\0' < auVar93[0xd]);
          auVar100[0xe] = -('\0' < auVar93[0xe]);
          bVar12 = '\0' < auVar93[0xf];
          auVar100[0xf] = -bVar12;
          if ((((((((((((((((auVar100 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                           (auVar100 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar100 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar100 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar100 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar100 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar100 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar100 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar100 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar100 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar100 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar100 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar100 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar100 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar100 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) || bVar12) {
            out = *(undefined1 (*) [16])((long)out + 0x40) + 8;
            src = (char *)((long)src + 0x60);
            uVar13 = uVar13 - 6;
            goto LAB_00105669;
          }
          auVar68[0] = auVar67[0] - (auVar81[0] == cVar24);
          auVar68[1] = auVar67[1] - (auVar81[1] == cVar25);
          auVar68[2] = auVar67[2] - (auVar81[2] == cVar26);
          auVar68[3] = auVar67[3] - (auVar81[3] == cVar27);
          auVar68[4] = auVar67[4] - (auVar81[4] == cVar28);
          auVar68[5] = auVar67[5] - (auVar81[5] == cVar29);
          auVar68[6] = auVar67[6] - (auVar81[6] == cVar30);
          auVar68[7] = auVar67[7] - (auVar81[7] == cVar31);
          auVar68[8] = auVar67[8] - (auVar81[8] == cVar32);
          auVar68[9] = auVar67[9] - (auVar81[9] == cVar33);
          auVar68[10] = auVar67[10] - (auVar81[10] == cVar34);
          auVar68[0xb] = auVar67[0xb] - (auVar81[0xb] == cVar35);
          auVar68[0xc] = auVar67[0xc] - (auVar81[0xc] == cVar36);
          auVar68[0xd] = auVar67[0xd] - (auVar81[0xd] == cVar37);
          auVar68[0xe] = auVar67[0xe] - (auVar81[0xe] == cVar38);
          auVar68[0xf] = auVar67[0xf] - (auVar81[0xf] == cVar39);
          auVar79 = pshufb(auVar21,auVar68);
          auVar87[0] = auVar79[0] + auVar81[0];
          auVar87[1] = auVar79[1] + auVar81[1];
          auVar87[2] = auVar79[2] + auVar81[2];
          auVar87[3] = auVar79[3] + auVar81[3];
          auVar87[4] = auVar79[4] + auVar81[4];
          auVar87[5] = auVar79[5] + auVar81[5];
          auVar87[6] = auVar79[6] + auVar81[6];
          auVar87[7] = auVar79[7] + auVar81[7];
          auVar87[8] = auVar79[8] + auVar81[8];
          auVar87[9] = auVar79[9] + auVar81[9];
          auVar87[10] = auVar79[10] + auVar81[10];
          auVar87[0xb] = auVar79[0xb] + auVar81[0xb];
          auVar87[0xc] = auVar79[0xc] + auVar81[0xc];
          auVar87[0xd] = auVar79[0xd] + auVar81[0xd];
          auVar87[0xe] = auVar79[0xe] + auVar81[0xe];
          auVar87[0xf] = auVar79[0xf] + auVar81[0xf];
          auVar81 = pmaddubsw(auVar87,auVar5);
          auVar81 = pmaddwd(auVar81,auVar6);
          auVar81 = pshufb(auVar81,auVar7);
          *(undefined1 (*) [16])(*(undefined1 (*) [16])((long)out + 0x40) + 8) = auVar81;
          out = *(undefined1 (*) [16])((long)out + 0x50) + 4;
          auVar81 = *(undefined1 (*) [16])((long)src + 0x70);
          src = (char *)((long)src + 0x70);
          auVar69._0_4_ = auVar81._0_4_ >> 4;
          auVar69._4_4_ = auVar81._4_4_ >> 4;
          auVar69._8_4_ = auVar81._8_4_ >> 4;
          auVar69._12_4_ = auVar81._12_4_ >> 4;
          auVar69 = auVar69 & auVar22;
          auVar79 = pshufb(auVar23,auVar69);
          auVar93 = pshufb(auVar4,auVar81 & auVar3);
          auVar93 = auVar93 & auVar79;
          auVar101[0] = -('\0' < auVar93[0]);
          auVar101[1] = -('\0' < auVar93[1]);
          auVar101[2] = -('\0' < auVar93[2]);
          auVar101[3] = -('\0' < auVar93[3]);
          auVar101[4] = -('\0' < auVar93[4]);
          auVar101[5] = -('\0' < auVar93[5]);
          auVar101[6] = -('\0' < auVar93[6]);
          auVar101[7] = -('\0' < auVar93[7]);
          auVar101[8] = -('\0' < auVar93[8]);
          auVar101[9] = -('\0' < auVar93[9]);
          auVar101[10] = -('\0' < auVar93[10]);
          auVar101[0xb] = -('\0' < auVar93[0xb]);
          auVar101[0xc] = -('\0' < auVar93[0xc]);
          auVar101[0xd] = -('\0' < auVar93[0xd]);
          auVar101[0xe] = -('\0' < auVar93[0xe]);
          bVar12 = '\0' < auVar93[0xf];
          auVar101[0xf] = -bVar12;
          lVar20 = -8;
          pauVar10 = (undefined1 (*) [16])out;
          pauVar14 = (undefined1 (*) [16])src;
          if ((((((((((((((((auVar101 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                           (auVar101 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar101 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar101 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar101 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar101 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar101 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar101 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar101 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar101 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar101 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar101 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar101 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar101 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar101 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) || bVar12) {
            uVar13 = uVar13 - 7;
            goto LAB_00105669;
          }
LAB_001055bd:
          auVar92[0] = auVar69[0] - (auVar81[0] == cVar24);
          auVar92[1] = auVar69[1] - (auVar81[1] == cVar25);
          auVar92[2] = auVar69[2] - (auVar81[2] == cVar26);
          auVar92[3] = auVar69[3] - (auVar81[3] == cVar27);
          auVar92[4] = auVar69[4] - (auVar81[4] == cVar28);
          auVar92[5] = auVar69[5] - (auVar81[5] == cVar29);
          auVar92[6] = auVar69[6] - (auVar81[6] == cVar30);
          auVar92[7] = auVar69[7] - (auVar81[7] == cVar31);
          auVar92[8] = auVar69[8] - (auVar81[8] == cVar32);
          auVar92[9] = auVar69[9] - (auVar81[9] == cVar33);
          auVar92[10] = auVar69[10] - (auVar81[10] == cVar34);
          auVar92[0xb] = auVar69[0xb] - (auVar81[0xb] == cVar35);
          auVar92[0xc] = auVar69[0xc] - (auVar81[0xc] == cVar36);
          auVar92[0xd] = auVar69[0xd] - (auVar81[0xd] == cVar37);
          auVar92[0xe] = auVar69[0xe] - (auVar81[0xe] == cVar38);
          auVar92[0xf] = auVar69[0xf] - (auVar81[0xf] == cVar39);
          auVar79 = pshufb(auVar21,auVar92);
          auVar77[0] = auVar79[0] + auVar81[0];
          auVar77[1] = auVar79[1] + auVar81[1];
          auVar77[2] = auVar79[2] + auVar81[2];
          auVar77[3] = auVar79[3] + auVar81[3];
          auVar77[4] = auVar79[4] + auVar81[4];
          auVar77[5] = auVar79[5] + auVar81[5];
          auVar77[6] = auVar79[6] + auVar81[6];
          auVar77[7] = auVar79[7] + auVar81[7];
          auVar77[8] = auVar79[8] + auVar81[8];
          auVar77[9] = auVar79[9] + auVar81[9];
          auVar77[10] = auVar79[10] + auVar81[10];
          auVar77[0xb] = auVar79[0xb] + auVar81[0xb];
          auVar77[0xc] = auVar79[0xc] + auVar81[0xc];
          auVar77[0xd] = auVar79[0xd] + auVar81[0xd];
          auVar77[0xe] = auVar79[0xe] + auVar81[0xe];
          auVar77[0xf] = auVar79[0xf] + auVar81[0xf];
          auVar81 = pmaddubsw(auVar77,auVar5);
          auVar81 = pmaddwd(auVar81,auVar6);
          auVar81 = pshufb(auVar81,auVar7);
          *pauVar10 = auVar81;
          src = (char *)(pauVar14 + 1);
          out = *pauVar10 + 0xc;
          uVar13 = uVar13 + lVar20;
        } while (uVar13 != 0);
        uVar13 = 0;
LAB_00105669:
        srclen = (srclen - (srclen - 8 & 0xfffffffffffffff0)) + uVar13 * 0x10;
        sVar18 = sVar18 + (uVar19 - uVar13) * 0xc;
      }
      bVar12 = srclen == 0;
      srclen = srclen - 1;
      if (bVar12) {
        uVar16 = 0;
        bVar12 = true;
        iVar9 = 0;
        break;
      }
      puVar2 = *(undefined1 (*) [16])src;
      if (0xfd < base64_table_dec_8bit[(byte)*puVar2]) {
        bVar12 = false;
        goto LAB_001057a7;
      }
      src = *(undefined1 (*) [16])src + 1;
      bVar15 = base64_table_dec_8bit[(byte)*puVar2] << 2;
      sVar17 = sVar18;
switchD_00104e5b_caseD_1:
      uVar16 = 1;
      sVar11 = srclen - 1;
      sVar18 = sVar17;
      if (srclen == 0) {
LAB_00105755:
        bVar12 = true;
        break;
      }
      bVar1 = base64_table_dec_8bit[(byte)*src];
      if (0xfd < bVar1) {
        iVar9 = 2;
        uVar8 = 1;
        goto switchD_00104e5b_default;
      }
      src = (char *)((byte *)src + 1);
      (*(undefined1 (*) [16])out)[0] = bVar1 >> 4 | bVar15;
      out = *(undefined1 (*) [16])out + 1;
      bVar15 = bVar1 << 4;
      sVar17 = sVar17 + 1;
switchD_00104e5b_caseD_2:
      bVar12 = true;
      srclen = sVar11 - 1;
      sVar18 = sVar17;
      if (sVar11 == 0) {
        uVar16 = 2;
        break;
      }
      bVar1 = *src;
      src = (char *)((byte *)src + 1);
      bVar1 = base64_table_dec_8bit[bVar1];
      if (0xfd < bVar1) {
        iVar9 = 0;
        uVar16 = 3;
        uVar8 = 3;
        if (bVar1 != 0xfe) goto switchD_00104e5b_default;
        if (srclen == 0) {
          iVar9 = 1;
          break;
        }
        bVar1 = base64_table_dec_8bit[(byte)*src];
        bVar12 = sVar11 == 2;
        goto LAB_00105794;
      }
      *out = bVar1 >> 2 | bVar15;
      out = (char *)((byte *)out + 1);
      bVar15 = bVar1 << 6;
      sVar17 = sVar17 + 1;
switchD_00104e5b_caseD_3:
      bVar12 = srclen == 0;
      srclen = srclen - 1;
      sVar18 = sVar17;
      if (bVar12) {
        uVar16 = 3;
        goto LAB_00105755;
      }
      bVar1 = base64_table_dec_8bit[(byte)*src];
      if (0xfd < bVar1) goto code_r0x00105747;
      src = (char *)((byte *)src + 1);
      *out = bVar1 | bVar15;
      out = (char *)((byte *)out + 1);
      sVar18 = sVar17 + 1;
      bVar15 = 0;
    } while( true );
  case 1:
    goto switchD_00104e5b_caseD_1;
  case 2:
    goto switchD_00104e5b_caseD_2;
  case 3:
    goto switchD_00104e5b_caseD_3;
  default:
switchD_00104e5b_default:
    uVar16 = uVar8;
    bVar12 = false;
    sVar18 = sVar17;
  }
  goto LAB_001057aa;
code_r0x00105747:
  bVar12 = srclen == 0;
LAB_00105794:
  bVar12 = (bool)(bVar12 & bVar1 == 0xfe);
LAB_001057a7:
  iVar9 = 2;
  uVar16 = 0;
LAB_001057aa:
  state->eof = iVar9;
  state->bytes = uVar16;
  state->carry = bVar15;
  *outlen = sVar18;
LAB_001057b7:
  return (int)bVar12;
}

Assistant:

BASE64_DEC_FUNCTION(sse41)
{
#if HAVE_SSE41
	#include "../generic/dec_head.c"
	dec_loop_ssse3(&s, &slen, &o, &olen);
	#include "../generic/dec_tail.c"
#else
	BASE64_DEC_STUB
#endif
}